

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  CallBasicTests();
  CallMultithreadTests();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	(void)argc;
	(void)argv;

	CallBasicTests();
	CallMultithreadTests();
	//std::cin.get();

	return 0;
}